

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_constant_folding.cpp
# Opt level: O2

ir_visitor_status __thiscall
anon_unknown.dwarf_89e80::ir_constant_folding_visitor::visit_enter
          (ir_constant_folding_visitor *this,ir_discard *ir)

{
  ir_rvalue **ppiVar1;
  ir_rvalue *piVar2;
  exec_node *peVar3;
  exec_node *peVar4;
  
  piVar2 = ir->condition;
  if (piVar2 != (ir_rvalue *)0x0) {
    ppiVar1 = &ir->condition;
    (*(piVar2->super_ir_instruction)._vptr_ir_instruction[3])(piVar2,this);
    (*(this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
      _vptr_ir_hierarchical_visitor[0x28])(this,ppiVar1);
    piVar2 = *ppiVar1;
    if ((piVar2 != (ir_rvalue *)0x0) && ((piVar2->super_ir_instruction).ir_type == ir_type_constant)
       ) {
      if (*(char *)&piVar2[1].super_ir_instruction._vptr_ir_instruction == '\x01') {
        *ppiVar1 = (ir_rvalue *)0x0;
      }
      else {
        peVar3 = (ir->super_ir_jump).super_ir_instruction.super_exec_node.next;
        peVar4 = (ir->super_ir_jump).super_ir_instruction.super_exec_node.prev;
        peVar3->prev = peVar4;
        peVar4->next = peVar3;
        (ir->super_ir_jump).super_ir_instruction.super_exec_node.next = (exec_node *)0x0;
        (ir->super_ir_jump).super_ir_instruction.super_exec_node.prev = (exec_node *)0x0;
      }
      (this->super_ir_rvalue_visitor).super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.
      field_0x31 = 1;
    }
  }
  return visit_continue_with_parent;
}

Assistant:

ir_visitor_status
ir_constant_folding_visitor::visit_enter(ir_discard *ir)
{
   if (ir->condition) {
      ir->condition->accept(this);
      handle_rvalue(&ir->condition);

      ir_constant *const_val = ir->condition->as_constant();
      /* If the condition is constant, either remove the condition or
       * remove the never-executed assignment.
       */
      if (const_val) {
         if (const_val->value.b[0])
            ir->condition = NULL;
         else
            ir->remove();
         this->progress = true;
      }
   }

   return visit_continue_with_parent;
}